

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void text_select(t_gobj *z,_glist *glist,int state)

{
  int iVar1;
  _rtext *x;
  char *pcVar2;
  char buf [1000];
  char local_408 [1000];
  
  x = glist_findrtext(glist,(t_text *)z);
  rtext_select(x,state);
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    iVar1 = gobj_shouldvis(z,glist);
    if (iVar1 != 0) {
      pcVar2 = rtext_gettag(x);
      sprintf(local_408,"%sR",pcVar2);
      pcVar2 = "blue";
      if (state == 0) {
        pcVar2 = "black";
      }
      pdgui_vmess((char *)0x0,"crs rr",glist,"itemconfigure",local_408,"-fill",pcVar2);
    }
  }
  return;
}

Assistant:

static void text_select(t_gobj *z, t_glist *glist, int state)
{
    t_text *x = (t_text *)z;
    t_rtext *y = glist_findrtext(glist, x);
    rtext_select(y, state);
    if (glist_isvisible(glist) && gobj_shouldvis(&x->te_g, glist))
    {
        char buf[MAXPDSTRING];
        sprintf(buf, "%sR", rtext_gettag(y));
        pdgui_vmess(0, "crs rr",
            glist,
            "itemconfigure",
            buf,
            "-fill", (state? "blue" : "black"));
    }
}